

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O1

DdNode * extraBddSpaceEquationsPos(DdManager *dd,DdNode *bF)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *n;
  DdNode *T;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  ulong uVar6;
  
  pDVar2 = dd->one;
  if ((DdNode *)((ulong)pDVar2 ^ 1) == bF) {
    return pDVar2;
  }
  if (pDVar2 == bF) {
    return dd->zero;
  }
  pDVar2 = cuddCacheLookup1Zdd(dd,extraBddSpaceEquationsPos,bF);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  pDVar3 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  pDVar2 = (pDVar3->type).kids.E;
  if (pDVar3 == bF) {
    pDVar5 = (pDVar3->type).kids.T;
  }
  else {
    pDVar2 = (DdNode *)((ulong)pDVar2 ^ 1);
    pDVar5 = (DdNode *)((ulong)(pDVar3->type).kids.T ^ 1);
  }
  pDVar4 = (DdNode *)((ulong)dd->one ^ 1);
  if (pDVar2 != pDVar4) {
    pDVar2 = extraBddSpaceEquationsPos(dd,pDVar2);
    if (pDVar5 == pDVar4) {
      if (pDVar2 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      goto LAB_00812ada;
    }
    if (pDVar2 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar4 = extraBddSpaceEquationsPos(dd,pDVar5);
    if (pDVar4 == (DdNode *)0x0) goto LAB_00812b17;
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar5 = extraBddSpaceEquationsNeg(dd,pDVar5);
    if (pDVar5 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      n = cuddZddIntersect(dd,pDVar2,pDVar4);
      if (n != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        T = cuddZddIntersect(dd,pDVar2,pDVar5);
        if (T == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,n);
          Cudd_RecursiveDerefZdd(dd,pDVar5);
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          pDVar2 = pDVar4;
          goto LAB_00812b17;
        }
        uVar6 = (ulong)T & 0xfffffffffffffffe;
        *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + 1;
        Cudd_RecursiveDerefZdd(dd,pDVar5);
        Cudd_RecursiveDerefZdd(dd,pDVar2);
        Cudd_RecursiveDerefZdd(dd,pDVar4);
        pDVar3 = cuddZddGetNode(dd,pDVar3->index * 2,T,n);
        if (pDVar3 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,n);
          pDVar2 = T;
          goto LAB_00812b17;
        }
        piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        goto LAB_00812acf;
      }
      Cudd_RecursiveDerefZdd(dd,pDVar5);
    }
    Cudd_RecursiveDerefZdd(dd,pDVar2);
    pDVar2 = pDVar4;
LAB_00812b17:
    Cudd_RecursiveDerefZdd(dd,pDVar2);
    return (DdNode *)0x0;
  }
  pDVar2 = extraBddSpaceEquationsPos(dd,pDVar5);
  if (pDVar2 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  uVar6 = (ulong)pDVar2 & 0xfffffffffffffffe;
  *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + 1;
  pDVar3 = cuddZddGetNode(dd,pDVar3->index * 2,dd->one,pDVar2);
  if (pDVar3 == (DdNode *)0x0) goto LAB_00812b17;
LAB_00812acf:
  *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + -1;
  pDVar2 = pDVar3;
LAB_00812ada:
  cuddCacheInsert1(dd,extraBddSpaceEquationsPos,bF,pDVar2);
  return pDVar2;
}

Assistant:

DdNode * extraBddSpaceEquationsPos( DdManager * dd, DdNode * bF )
{
    DdNode * zRes;
    statLine( dd );

    if ( bF == b0 )
        return z1;
    if ( bF == b1 )
        return z0;
    
    if ( (zRes = cuddCacheLookup1Zdd(dd, extraBddSpaceEquationsPos, bF)) )
        return zRes;
    else
    {
        DdNode * bFR, * bF0,  * bF1;
        DdNode * zPos0, * zPos1, * zNeg1; 
        DdNode * zRes, * zRes0, * zRes1;

        bFR = Cudd_Regular(bF);
        if ( bFR != bF ) // bF is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        if ( bF0 == b0 )
        {
            zRes1 = extraBddSpaceEquationsPos( dd, bF1 );
            if ( zRes1 == NULL )
                return NULL;
            cuddRef( zRes1 );

            // add the current element to the set
            zRes = cuddZddGetNode( dd, 2*bFR->index, z1, zRes1 );
            if ( zRes == NULL ) 
            {
                Cudd_RecursiveDerefZdd(dd, zRes1);
                return NULL;
            }
            cuddDeref( zRes1 );
        }
        else if ( bF1 == b0 )
        {
            zRes = extraBddSpaceEquationsPos( dd, bF0 );
            if ( zRes == NULL )
                return NULL;
        }
        else
        {
            zPos0 = extraBddSpaceEquationsPos( dd, bF0 );
            if ( zPos0 == NULL )
                return NULL;
            cuddRef( zPos0 );

            zPos1 = extraBddSpaceEquationsPos( dd, bF1 );
            if ( zPos1 == NULL )
            {
                Cudd_RecursiveDerefZdd(dd, zPos0);
                return NULL;
            }
            cuddRef( zPos1 );

            zNeg1 = extraBddSpaceEquationsNeg( dd, bF1 );
            if ( zNeg1 == NULL )
            {
                Cudd_RecursiveDerefZdd(dd, zPos0);
                Cudd_RecursiveDerefZdd(dd, zPos1);
                return NULL;
            }
            cuddRef( zNeg1 );


            zRes0 = cuddZddIntersect( dd, zPos0, zPos1 );
            if ( zRes0 == NULL )
            {
                Cudd_RecursiveDerefZdd(dd, zNeg1);
                Cudd_RecursiveDerefZdd(dd, zPos0);
                Cudd_RecursiveDerefZdd(dd, zPos1);
                return NULL;
            }
            cuddRef( zRes0 );

            zRes1 = cuddZddIntersect( dd, zPos0, zNeg1 );
            if ( zRes1 == NULL )
            {
                Cudd_RecursiveDerefZdd(dd, zRes0);
                Cudd_RecursiveDerefZdd(dd, zNeg1);
                Cudd_RecursiveDerefZdd(dd, zPos0);
                Cudd_RecursiveDerefZdd(dd, zPos1);
                return NULL;
            }
            cuddRef( zRes1 );
            Cudd_RecursiveDerefZdd(dd, zNeg1);
            Cudd_RecursiveDerefZdd(dd, zPos0);
            Cudd_RecursiveDerefZdd(dd, zPos1);
            // only zRes0 and zRes1 are refed at this point

            zRes = cuddZddGetNode( dd, 2*bFR->index, zRes1, zRes0 );
            if ( zRes == NULL ) 
            {
                Cudd_RecursiveDerefZdd(dd, zRes0);
                Cudd_RecursiveDerefZdd(dd, zRes1);
                return NULL;
            }
            cuddDeref( zRes0 );
            cuddDeref( zRes1 );
        }

        cuddCacheInsert1( dd, extraBddSpaceEquationsPos, bF, zRes );
        return zRes;
    }
}